

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_closed_list.hpp
# Opt level: O3

pair<bool,_bool> __thiscall
compress::CompressClosedList<Node<Tiles>_>::find_in_buffers
          (CompressClosedList<Node<Tiles>_> *this,Node<Tiles> *entry)

{
  pair<bool,_bool> pVar1;
  size_t sVar2;
  iterator __it;
  ulong uVar3;
  __hashtable *__h;
  _Hashtable<Node<Tiles>,_Node<Tiles>,_std::allocator<Node<Tiles>_>,_std::__detail::_Identity,_std::equal_to<Node<Tiles>_>,_TabulationHash<Node<Tiles>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  __node_gen_type __node_gen;
  
  if (this->enable_partitioning == true) {
    sVar2 = TabulationHash<Node<Tiles>_>::operator()(&this->partition_hasher,entry);
    uVar3 = sVar2 % (ulong)this->n_partitions;
  }
  else {
    uVar3 = 0;
  }
  this_00 = &(this->buffers).
             super__Vector_base<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>,_std::allocator<std::unordered_set<Node<Tiles>,_TabulationHash<Node<Tiles>_>,_std::equal_to<Node<Tiles>_>,_std::allocator<Node<Tiles>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar3]._M_h;
  __it = std::
         _Hashtable<Node<Tiles>,_Node<Tiles>,_std::allocator<Node<Tiles>_>,_std::__detail::_Identity,_std::equal_to<Node<Tiles>_>,_TabulationHash<Node<Tiles>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
         ::find(this_00,entry);
  if (__it.super__Node_iterator_base<Node<Tiles>,_true>._M_cur == (__node_type *)0x0) {
    pVar1.first = false;
    pVar1.second = false;
  }
  else {
    this->buffer_hits = this->buffer_hits + 1;
    pVar1.first = true;
    pVar1.second = false;
    if ((this->reopen_closed == true) &&
       (entry->g < *(char *)((long)__it.super__Node_iterator_base<Node<Tiles>,_true>._M_cur + 9))) {
      std::
      _Hashtable<Node<Tiles>,_Node<Tiles>,_std::allocator<Node<Tiles>_>,_std::__detail::_Identity,_std::equal_to<Node<Tiles>_>,_TabulationHash<Node<Tiles>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::erase(this_00,(const_iterator)__it.super__Node_iterator_base<Node<Tiles>,_true>._M_cur);
      std::
      _Hashtable<Node<Tiles>,Node<Tiles>,std::allocator<Node<Tiles>>,std::__detail::_Identity,std::equal_to<Node<Tiles>>,TabulationHash<Node<Tiles>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<Node<Tiles>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Node<Tiles>,true>>>>
                ((_Hashtable<Node<Tiles>,Node<Tiles>,std::allocator<Node<Tiles>>,std::__detail::_Identity,std::equal_to<Node<Tiles>>,TabulationHash<Node<Tiles>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this_00,entry);
      pVar1.first = true;
      pVar1.second = true;
    }
  }
  return pVar1;
}

Assistant:

pair<found, reopened> CompressClosedList<Entry>::
    find_in_buffers(const Entry &entry) {
        auto partition_value = get_partition_value(entry);
        
        auto& buffer = buffers[partition_value];
        
        auto buffer_it = buffer.find(entry);
        if (buffer_it != buffer.end()) {
            ++buffer_hits;
            if (reopen_closed) {
                if (entry.g < buffer_it->g) {
                    buffer.erase(buffer_it);
                    buffer.insert(entry);
                    return make_pair(true, true);
                }
            }
            return make_pair(true, false);
        }
        return make_pair(false, false);
    }